

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessellationShaderCase::iterate
          (TessellationShaderCase *this)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar2;
  deBool dVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  undefined4 extraout_var;
  TestLog *pTVar6;
  ProgramSources *pPVar7;
  TestError *pTVar8;
  string *psVar9;
  string local_a08;
  ShaderSource local_9e8;
  string local_9c0;
  ShaderSource local_9a0;
  string local_978;
  ShaderSource local_958;
  string local_930;
  ShaderSource local_910;
  ProgramSources local_8e8;
  undefined1 local_818 [8];
  ShaderProgram program_2;
  string local_740;
  allocator<char> local_719;
  string local_718;
  ScopedLogSection local_6f8;
  ScopedLogSection section_2;
  ShaderSource local_6d0;
  string local_6a8;
  ShaderSource local_688;
  string local_660;
  ShaderSource local_640;
  string local_618;
  ShaderSource local_5f8;
  ProgramSources local_5d0;
  undefined1 local_500 [8];
  ShaderProgram program_1;
  string local_428;
  allocator<char> local_401;
  string local_400;
  ScopedLogSection local_3e0;
  ScopedLogSection section_1;
  ShaderSource local_3b8;
  string local_390;
  ShaderSource local_370;
  string local_348;
  ShaderSource local_328;
  string local_300;
  ShaderSource local_2e0;
  ProgramSources local_2b8;
  undefined1 local_1e8 [8];
  ShaderProgram program;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  ScopedLogSection local_c8;
  ScopedLogSection section;
  string local_b8;
  undefined1 local_98 [8];
  ResultCollector result;
  CallLogWrapper gl;
  bool supportsES32;
  TessellationShaderCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if (!bVar1) {
    this_00 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_tessellation_shader");
    if (!bVar1) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,
                 "Tessellation shader tests require GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0xde);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8," // ERROR: ",(allocator<char> *)((long)&section.m_log + 7));
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_98,pTVar6,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Query State",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"3 vertices, triangles, equal_spacing, cw",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  psVar9 = &local_110;
  tcu::ScopedLogSection::ScopedLogSection(&local_c8,pTVar6,&local_e8,psVar9);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_2b8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_300,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar9);
  glu::VertexSource::VertexSource((VertexSource *)&local_2e0,&local_300);
  pPVar7 = glu::ProgramSources::operator<<(&local_2b8,&local_2e0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_348,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar9);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_328,&local_348);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_328);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_390,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 3) out;\nvoid main()\n{\n}\n"
             ,(char *)psVar9);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_370,&local_390);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_370);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section_1,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(triangles, equal_spacing, cw) in;\nvoid main()\n{\n}\n"
             ,(char *)psVar9);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3b8,(string *)&section_1);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_3b8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1e8,pRVar5,pPVar7);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_3b8);
  std::__cxx11::string::~string((string *)&section_1);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  glu::VertexSource::~VertexSource((VertexSource *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  glu::ProgramSources::~ProgramSources(&local_2b8);
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
         (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_1e8), bVar1))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar6,(ShaderProgram *)local_1e8);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e8);
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar4,0x8e75,3,this->m_verifier);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e8);
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar4,0x8e76,4,this->m_verifier);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e8);
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar4,0x8e77,0x202,this->m_verifier);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e8);
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar4,0x8e78,0x900,this->m_verifier);
      dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_1e8);
      deqp::gls::StateQueryUtil::verifyStateProgramInteger
                ((ResultCollector *)local_98,(CallLogWrapper *)((long)&result.m_message.field_2 + 8)
                 ,dVar4,0x8e79,0,this->m_verifier);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1e8);
      tcu::ScopedLogSection::~ScopedLogSection(&local_c8);
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_400,"Query State",&local_401);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_428,"5 vertices, quads, fractional_even_spacing, ccw",
                 (allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
      psVar9 = &local_428;
      tcu::ScopedLogSection::ScopedLogSection(&local_3e0,pTVar6,&local_400,psVar9);
      std::__cxx11::string::~string((string *)&local_428);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&program_1.m_program.m_info.linkTimeUs + 7));
      std::__cxx11::string::~string((string *)&local_400);
      std::allocator<char>::~allocator(&local_401);
      pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_5d0);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_618,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar9);
      glu::VertexSource::VertexSource((VertexSource *)&local_5f8,&local_618);
      pPVar7 = glu::ProgramSources::operator<<(&local_5d0,&local_5f8);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_660,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar9);
      glu::FragmentSource::FragmentSource((FragmentSource *)&local_640,&local_660);
      pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_640);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_6a8,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 5) out;\nvoid main()\n{\n}\n"
                 ,(char *)psVar9);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)&local_688,&local_6a8);
      pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_688);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                ((string *)&section_2,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(quads, fractional_even_spacing, ccw) in;\nvoid main()\n{\n}\n"
                 ,(char *)psVar9);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_6d0,(string *)&section_2);
      pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_6d0);
      glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_500,pRVar5,pPVar7);
      glu::TessellationEvaluationSource::~TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_6d0);
      std::__cxx11::string::~string((string *)&section_2);
      glu::TessellationControlSource::~TessellationControlSource
                ((TessellationControlSource *)&local_688);
      std::__cxx11::string::~string((string *)&local_6a8);
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_640);
      std::__cxx11::string::~string((string *)&local_660);
      glu::VertexSource::~VertexSource((VertexSource *)&local_5f8);
      std::__cxx11::string::~string((string *)&local_618);
      glu::ProgramSources::~ProgramSources(&local_5d0);
      while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
             (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_500), bVar1))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          glu::operator<<(pTVar6,(ShaderProgram *)local_500);
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_500);
          deqp::gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_98,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e75,5,
                     this->m_verifier);
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_500);
          deqp::gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_98,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e76,7,
                     this->m_verifier);
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_500);
          deqp::gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_98,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e77,0x8e7c,
                     this->m_verifier);
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_500);
          deqp::gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_98,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e78,0x901,
                     this->m_verifier);
          dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_500);
          deqp::gls::StateQueryUtil::verifyStateProgramInteger
                    ((ResultCollector *)local_98,
                     (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e79,0,
                     this->m_verifier);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_500);
          tcu::ScopedLogSection::~ScopedLogSection(&local_3e0);
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_718,"Query State",&local_719);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_740,
                     "5 vertices, isolines, fractional_odd_spacing, ccw, point_mode",
                     (allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
          psVar9 = &local_740;
          tcu::ScopedLogSection::ScopedLogSection(&local_6f8,pTVar6,&local_718,psVar9);
          std::__cxx11::string::~string((string *)&local_740);
          std::allocator<char>::~allocator
                    ((allocator<char> *)((long)&program_2.m_program.m_info.linkTimeUs + 7));
          std::__cxx11::string::~string((string *)&local_718);
          std::allocator<char>::~allocator(&local_719);
          pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
          glu::ProgramSources::ProgramSources(&local_8e8);
          Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                    (&local_930,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                     (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar9);
          glu::VertexSource::VertexSource((VertexSource *)&local_910,&local_930);
          pPVar7 = glu::ProgramSources::operator<<(&local_8e8,&local_910);
          Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                    (&local_978,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                     (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar9);
          glu::FragmentSource::FragmentSource((FragmentSource *)&local_958,&local_978);
          pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_958);
          Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                    (&local_9c0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                     (Context *)
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 5) out;\nvoid main()\n{\n}\n"
                     ,(char *)psVar9);
          glu::TessellationControlSource::TessellationControlSource
                    ((TessellationControlSource *)&local_9a0,&local_9c0);
          pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_9a0);
          Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                    (&local_a08,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                     (Context *)
                     "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines, fractional_odd_spacing, ccw, point_mode) in;\nvoid main()\n{\n}\n"
                     ,(char *)psVar9);
          glu::TessellationEvaluationSource::TessellationEvaluationSource
                    ((TessellationEvaluationSource *)&local_9e8,&local_a08);
          pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_9e8);
          glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_818,pRVar5,pPVar7);
          glu::TessellationEvaluationSource::~TessellationEvaluationSource
                    ((TessellationEvaluationSource *)&local_9e8);
          std::__cxx11::string::~string((string *)&local_a08);
          glu::TessellationControlSource::~TessellationControlSource
                    ((TessellationControlSource *)&local_9a0);
          std::__cxx11::string::~string((string *)&local_9c0);
          glu::FragmentSource::~FragmentSource((FragmentSource *)&local_958);
          std::__cxx11::string::~string((string *)&local_978);
          glu::VertexSource::~VertexSource((VertexSource *)&local_910);
          std::__cxx11::string::~string((string *)&local_930);
          glu::ProgramSources::~ProgramSources(&local_8e8);
          while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
                 (bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_818), bVar1))) {
            dVar3 = ::deGetFalse();
            if (dVar3 == 0) {
              pTVar6 = tcu::TestContext::getLog
                                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              glu::operator<<(pTVar6,(ShaderProgram *)local_818);
              dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_818);
              deqp::gls::StateQueryUtil::verifyStateProgramInteger
                        ((ResultCollector *)local_98,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e75,5,
                         this->m_verifier);
              dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_818);
              deqp::gls::StateQueryUtil::verifyStateProgramInteger
                        ((ResultCollector *)local_98,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e76,0x8e7a
                         ,this->m_verifier);
              dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_818);
              deqp::gls::StateQueryUtil::verifyStateProgramInteger
                        ((ResultCollector *)local_98,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e77,0x8e7b
                         ,this->m_verifier);
              dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_818);
              deqp::gls::StateQueryUtil::verifyStateProgramInteger
                        ((ResultCollector *)local_98,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e78,0x901,
                         this->m_verifier);
              dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_818);
              deqp::gls::StateQueryUtil::verifyStateProgramInteger
                        ((ResultCollector *)local_98,
                         (CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar4,0x8e79,1,
                         this->m_verifier);
              glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_818);
              tcu::ScopedLogSection::~ScopedLogSection(&local_6f8);
              tcu::ResultCollector::setTestContextResult
                        ((ResultCollector *)local_98,
                         (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::ResultCollector::~ResultCollector((ResultCollector *)local_98);
              glu::CallLogWrapper::~CallLogWrapper
                        ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
              return STOP;
            }
          }
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,"Compile failed","program.isOk()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                     ,0x13c);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Compile failed","program.isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0x129);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Compile failed","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x116);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

TessellationShaderCase::IterateResult TessellationShaderCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		TCU_THROW(NotSupportedError, "Tessellation shader tests require GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context.");


	static const char* const	s_vtxFragTemplate	=	"${GLSL_VERSION_DECL}\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessCtrlTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(vertices = 3) out;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(triangles, equal_spacing, cw) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessCtrlTemplate2	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(vertices = 5) out;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate2	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(quads, fractional_even_spacing, ccw) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate3	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(isolines, fractional_odd_spacing, ccw, point_mode) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "3 vertices, triangles, equal_spacing, cw");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate1))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate1)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 3, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_TRIANGLES, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_EQUAL, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_FALSE, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "5 vertices, quads, fractional_even_spacing, ccw");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate2))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate2)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 5, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_QUADS, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_FRACTIONAL_EVEN, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CCW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_FALSE, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "5 vertices, isolines, fractional_odd_spacing, ccw, point_mode");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate2))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate3)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 5, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_ISOLINES, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_FRACTIONAL_ODD, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CCW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_TRUE, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}